

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O3

void __thiscall gjkepa2_impl::EPA::Initialize(EPA *this)

{
  U UVar1;
  int iVar2;
  sFace *psVar3;
  long lVar4;
  sFace *psVar5;
  
  this->m_status = Failed;
  iVar2 = 0;
  this->m_nextsv = 0;
  (this->m_normal).m_floats[0] = 0.0;
  (this->m_normal).m_floats[1] = 0.0;
  (this->m_normal).m_floats[2] = 0.0;
  (this->m_normal).m_floats[3] = 0.0;
  this->m_depth = 0.0;
  UVar1 = (this->m_stock).count;
  psVar5 = (this->m_stock).root;
  psVar3 = this->m_fc_store + 0x7f;
  lVar4 = 0x80;
  do {
    psVar3->l[0] = (sFace *)0x0;
    psVar3->l[1] = psVar5;
    if (psVar5 != (sFace *)0x0) {
      psVar5->l[0] = psVar3;
    }
    psVar5 = (sFace *)((long)this->m_fc_store[0].n.m_floats + (ulong)(uint)((0x7f - iVar2) * 0x60));
    (this->m_stock).root = psVar3;
    iVar2 = iVar2 + 1;
    psVar3 = psVar3 + -1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  (this->m_stock).count = UVar1 + 0x80;
  return;
}

Assistant:

void				Initialize()
			{
				m_status	=	eStatus::Failed;
				m_normal	=	btVector3(0,0,0);
				m_depth		=	0;
				m_nextsv	=	0;
				for(U i=0;i<EPA_MAX_FACES;++i)
				{
					append(m_stock,&m_fc_store[EPA_MAX_FACES-i-1]);
				}
			}